

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmAndRgEa<(moira::Instr)88,(moira::Mode)3,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  int iVar2;
  char *pcVar3;
  Ea<(moira::Mode)3,_1> dst;
  u32 local_1c;
  ushort local_18;
  
  local_18 = op & 7;
  local_1c = *addr;
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = 'o';
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = 'r';
  pcVar3 = str->ptr;
  SVar1 = str->style->syntax;
  str->ptr = pcVar3 + 1;
  if (2 < SVar1 - MOIRA_MIT) {
    *pcVar3 = '.';
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
  }
  *pcVar3 = 'b';
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  else {
    iVar2 = (str->tab).raw;
    pcVar3 = str->ptr;
    do {
      str->ptr = pcVar3 + 1;
      *pcVar3 = ' ';
      pcVar3 = str->ptr;
    } while (pcVar3 < str->base + iVar2);
  }
  StrWriter::operator<<(str,(Dn)(op >> 9 & 7));
  pcVar3 = str->ptr;
  str->ptr = pcVar3 + 1;
  *pcVar3 = ',';
  SVar1 = str->style->syntax;
  if ((SVar1 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar1 & 0x1f) & 1) != 0)) {
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)3,_1> *)&local_1c);
  return;
}

Assistant:

void
Moira::dasmAndRgEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
}